

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeMatrixShapesMatch
          (ValidationState_t *this,Instruction *inst,uint32_t m1,uint32_t m2)

{
  Op OVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_aa0;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_8c8;
  tuple<bool,_bool,_unsigned_int> local_8b0;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_8a8;
  tuple<bool,_bool,_unsigned_int> local_890;
  uint local_888;
  uint32_t local_884;
  uint32_t m2_use_id;
  uint32_t m1_use_id;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_6a8;
  tuple<bool,_bool,_unsigned_int> local_690;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_688;
  tuple<bool,_bool,_unsigned_int> local_670;
  DiagnosticStream local_668;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_490;
  tuple<bool,_bool,_unsigned_int> local_478;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_470;
  tuple<bool,_bool,_unsigned_int> local_458;
  DiagnosticStream local_450;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_278;
  tuple<bool,_bool,_unsigned_int> local_260;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_258;
  tuple<bool,_bool,_unsigned_int> local_23c;
  uint local_234;
  uint local_230;
  uint32_t m2_value;
  uint32_t m1_value;
  bool m2_is_const_int32;
  bool m2_is_int32;
  bool m1_is_const_int32;
  bool m1_is_int32;
  uint32_t m2_cols_id;
  uint32_t m2_rows_id;
  uint32_t m2_scope_id;
  uint32_t m1_cols_id;
  uint32_t m1_rows_id;
  uint32_t m1_scope_id;
  Instruction *local_38;
  Instruction *m2_type;
  Instruction *m1_type;
  uint32_t m2_local;
  uint32_t m1_local;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  m1_type._0_4_ = m2;
  m1_type._4_4_ = m1;
  _m2_local = inst;
  inst_local = (Instruction *)this;
  m2_type = FindDef(this,m1);
  local_38 = FindDef(this,(uint32_t)m1_type);
  OVar1 = Instruction::opcode(m2_type);
  OVar2 = Instruction::opcode(local_38);
  if (OVar1 == OVar2) {
    m1_cols_id = Instruction::GetOperandAs<unsigned_int>(m2_type,2);
    m2_scope_id = Instruction::GetOperandAs<unsigned_int>(m2_type,3);
    m2_rows_id = Instruction::GetOperandAs<unsigned_int>(m2_type,4);
    m2_cols_id = Instruction::GetOperandAs<unsigned_int>(local_38,2);
    _m2_is_const_int32 = Instruction::GetOperandAs<unsigned_int>(local_38,3);
    m1_value = Instruction::GetOperandAs<unsigned_int>(local_38,4);
    m2_value._3_1_ = 0;
    m2_value._2_1_ = 0;
    m2_value._1_1_ = 0;
    m2_value._0_1_ = 0;
    local_230 = 0;
    local_234 = 0;
    EvalInt32IfConst(&local_23c,this,m1_cols_id);
    std::tie<bool,bool,unsigned_int>
              (&local_258,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_230);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_258,&local_23c);
    EvalInt32IfConst(&local_260,this,m2_cols_id);
    std::tie<bool,bool,unsigned_int>
              (&local_278,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_234);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_278,&local_260);
    if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_230 == local_234)) {
      EvalInt32IfConst(&local_458,this,m2_scope_id);
      std::tie<bool,bool,unsigned_int>
                (&local_470,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_230);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_470,&local_458);
      EvalInt32IfConst(&local_478,this,_m2_is_const_int32);
      std::tie<bool,bool,unsigned_int>
                (&local_490,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_234);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_490,&local_478);
      if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_230 == local_234))
      {
        EvalInt32IfConst(&local_670,this,m2_rows_id);
        std::tie<bool,bool,unsigned_int>
                  (&local_688,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),&local_230
                  );
        std::tuple<bool&,bool&,unsigned_int&>::operator=
                  ((tuple<bool&,bool&,unsigned_int&> *)&local_688,&local_670);
        EvalInt32IfConst(&local_690,this,m1_value);
        std::tie<bool,bool,unsigned_int>
                  (&local_6a8,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_234);
        std::tuple<bool&,bool&,unsigned_int&>::operator=
                  ((tuple<bool&,bool&,unsigned_int&> *)&local_6a8,&local_690);
        if ((((m2_value._2_1_ & 1) == 0) || (((byte)m2_value & 1) == 0)) || (local_230 == local_234)
           ) {
          OVar1 = Instruction::opcode(m2_type);
          if (OVar1 == OpTypeCooperativeMatrixKHR) {
            local_884 = Instruction::GetOperandAs<unsigned_int>(m2_type,5);
            local_888 = Instruction::GetOperandAs<unsigned_int>(local_38,5);
            EvalInt32IfConst(&local_890,this,local_884);
            std::tie<bool,bool,unsigned_int>
                      (&local_8a8,(bool *)((long)&m2_value + 3),(bool *)((long)&m2_value + 2),
                       &local_230);
            std::tuple<bool&,bool&,unsigned_int&>::operator=
                      ((tuple<bool&,bool&,unsigned_int&> *)&local_8a8,&local_890);
            EvalInt32IfConst(&local_8b0,this,local_888);
            std::tie<bool,bool,unsigned_int>
                      (&local_8c8,(bool *)((long)&m2_value + 1),(bool *)&m2_value,&local_234);
            std::tuple<bool&,bool&,unsigned_int&>::operator=
                      ((tuple<bool&,bool&,unsigned_int&> *)&local_8c8,&local_8b0);
            if ((((m2_value._2_1_ & 1) != 0) && (((byte)m2_value & 1) != 0)) &&
               (local_230 != local_234)) {
              diag(&local_aa0,this,SPV_ERROR_INVALID_DATA,_m2_local);
              pDVar3 = DiagnosticStream::operator<<
                                 (&local_aa0,
                                  (char (*) [51])
                                  "Expected Use of Matrix type and Result Type to be ");
              pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [10])"identical");
              this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
              DiagnosticStream::~DiagnosticStream(&local_aa0);
              return this_local._4_4_;
            }
          }
          this_local._4_4_ = SPV_SUCCESS;
        }
        else {
          diag((DiagnosticStream *)&m2_use_id,this,SPV_ERROR_INVALID_DATA,_m2_local);
          pDVar3 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&m2_use_id,
                              (char (*) [55])
                              "Expected columns of Matrix type and Result Type to be ");
          pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [10])"identical");
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&m2_use_id);
        }
      }
      else {
        diag(&local_668,this,SPV_ERROR_INVALID_DATA,_m2_local);
        pDVar3 = DiagnosticStream::operator<<
                           (&local_668,
                            (char (*) [52])"Expected rows of Matrix type and Result Type to be ");
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [10])"identical");
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream(&local_668);
      }
    }
    else {
      diag(&local_450,this,SPV_ERROR_INVALID_DATA,_m2_local);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_450,
                          (char (*) [49])"Expected scopes of Matrix and Result Type to be ");
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [10])"identical");
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_450);
    }
  }
  else {
    diag((DiagnosticStream *)&m1_rows_id,this,SPV_ERROR_INVALID_DATA,_m2_local);
    pDVar3 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&m1_rows_id,
                        (char (*) [34])"Expected cooperative matrix types");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&m1_rows_id);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t ValidationState_t::CooperativeMatrixShapesMatch(
    const Instruction* inst, uint32_t m1, uint32_t m2) {
  const auto m1_type = FindDef(m1);
  const auto m2_type = FindDef(m2);

  if (m1_type->opcode() != m2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative matrix types";
  }

  uint32_t m1_scope_id = m1_type->GetOperandAs<uint32_t>(2);
  uint32_t m1_rows_id = m1_type->GetOperandAs<uint32_t>(3);
  uint32_t m1_cols_id = m1_type->GetOperandAs<uint32_t>(4);

  uint32_t m2_scope_id = m2_type->GetOperandAs<uint32_t>(2);
  uint32_t m2_rows_id = m2_type->GetOperandAs<uint32_t>(3);
  uint32_t m2_cols_id = m2_type->GetOperandAs<uint32_t>(4);

  bool m1_is_int32 = false, m1_is_const_int32 = false, m2_is_int32 = false,
       m2_is_const_int32 = false;
  uint32_t m1_value = 0, m2_value = 0;

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_scope_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_scope_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected scopes of Matrix and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_rows_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_rows_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected rows of Matrix type and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_cols_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_cols_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected columns of Matrix type and Result Type to be "
           << "identical";
  }

  if (m1_type->opcode() == spv::Op::OpTypeCooperativeMatrixKHR) {
    uint32_t m1_use_id = m1_type->GetOperandAs<uint32_t>(5);
    uint32_t m2_use_id = m2_type->GetOperandAs<uint32_t>(5);
    std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
        EvalInt32IfConst(m1_use_id);
    std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
        EvalInt32IfConst(m2_use_id);

    if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
      return diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Use of Matrix type and Result Type to be "
             << "identical";
    }
  }

  return SPV_SUCCESS;
}